

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retFun.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  string local_a0 [32];
  string local_80 [35];
  undefined1 local_5d;
  bool same;
  string local_50 [8];
  string string2;
  string local_30 [8];
  string string1;
  
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  poVar2 = std::operator<<((ostream *)&std::cout,"Enter two strings.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"String 1: ");
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_30);
  std::operator<<((ostream *)&std::cout,"String 2: ");
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_50);
  std::__cxx11::string::string(local_80,local_30);
  std::__cxx11::string::string(local_a0,local_50);
  bVar1 = StrComp((string *)local_80,(string *)local_a0);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_80);
  local_5d = bVar1;
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"The strings are the same.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"The strings are different.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main()
{
    string string1;
    string string2;

    cout << "Enter two strings." << endl;
    cout << "String 1: ";
    getline(cin, string1);
    cout << "String 2: ";
    getline(cin, string2);

    bool same = StrComp(string1, string2);

    if(same)
    {
        cout << "The strings are the same." << endl;
    }
    else
    {
        cout << "The strings are different." << endl;
    }

    return 0;
}